

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

int fmt::v7::detail::
    parse_nonnegative_int<char,fmt::v7::detail::precision_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>>&,char>&>
              (char **begin,char *end,
              precision_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>_&,_char>
              *eh)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  
  pbVar3 = (byte *)*begin;
  if ((pbVar3 == (byte *)end) || (bVar1 = *pbVar3, 9 < (byte)(bVar1 - 0x30))) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/../extern/fmt/include/fmt/format.h"
                ,0x800,"");
  }
  uVar2 = 0;
  do {
    pbVar3 = pbVar3 + 1;
    if (0xccccccc < uVar2) goto LAB_001c313f;
    uVar2 = ((uint)bVar1 + uVar2 * 10) - 0x30;
    *begin = (char *)pbVar3;
  } while ((pbVar3 != (byte *)end) && (bVar1 = *pbVar3, (byte)(bVar1 - 0x30) < 10));
  if (-1 < (int)uVar2) {
    return uVar2;
  }
LAB_001c313f:
  error_handler::on_error
            ((error_handler *)
             (eh->handler->
             super_dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>
             ).context_,"number is too big");
}

Assistant:

FMT_CONSTEXPR int parse_nonnegative_int(const Char*& begin, const Char* end,
                                        ErrorHandler&& eh) {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  constexpr unsigned max_int = max_value<int>();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int) eh.on_error("number is too big");
  return static_cast<int>(value);
}